

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4.c
# Opt level: O0

int MD4_Update(MD4_CTX *c,void *data,size_t len)

{
  uint uVar1;
  ulong uVar2;
  ulong __n;
  void *pvVar3;
  unsigned_long available;
  unsigned_long used;
  size_t sStack_20;
  MD4_u32plus saved_lo;
  unsigned_long size_local;
  void *data_local;
  MD4_CTX *ctx_local;
  
  uVar1 = c->A;
  c->A = uVar1 + (int)len & 0x1fffffff;
  if (c->A < uVar1) {
    c->B = c->B + 1;
  }
  c->B = ((uint)(len >> 0x1d) & 7) + c->B;
  uVar2 = (ulong)(uVar1 & 0x3f);
  sStack_20 = len;
  size_local = (unsigned_long)data;
  if (uVar2 != 0) {
    __n = 0x40 - uVar2;
    if (len < __n) {
      pvVar3 = memcpy((void *)((long)c->data + uVar2),data,len);
      return (int)pvVar3;
    }
    memcpy((void *)((long)c->data + uVar2),data,__n);
    size_local = (long)data + __n;
    sStack_20 = len - __n;
    my_md4_body((MD4_CTX *)c,c->data,0x40);
  }
  if (0x3f < sStack_20) {
    size_local = (unsigned_long)
                 my_md4_body((MD4_CTX *)c,(void *)size_local,sStack_20 & 0xffffffffffffffc0);
    sStack_20 = sStack_20 & 0x3f;
  }
  pvVar3 = memcpy(c->data,(void *)size_local,sStack_20);
  return (int)pvVar3;
}

Assistant:

static void MD4_Update(MD4_CTX *ctx, const void *data, unsigned long size)
{
  MD4_u32plus saved_lo;
  unsigned long used;

  saved_lo = ctx->lo;
  ctx->lo = (saved_lo + size) & 0x1fffffff;
  if(ctx->lo < saved_lo)
    ctx->hi++;
  ctx->hi += (MD4_u32plus)size >> 29;

  used = saved_lo & 0x3f;

  if(used) {
    unsigned long available = 64 - used;

    if(size < available) {
      memcpy(&ctx->buffer[used], data, size);
      return;
    }

    memcpy(&ctx->buffer[used], data, available);
    data = (const unsigned char *)data + available;
    size -= available;
    my_md4_body(ctx, ctx->buffer, 64);
  }

  if(size >= 64) {
    data = my_md4_body(ctx, data, size & ~(unsigned long)0x3f);
    size &= 0x3f;
  }

  memcpy(ctx->buffer, data, size);
}